

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlText::Clone(TiXmlText *this)

{
  TiXmlText *clone;
  TiXmlText *this_local;
  
  this_local = (TiXmlText *)operator_new(0x58);
  TiXmlText(this_local,"");
  if (this_local == (TiXmlText *)0x0) {
    this_local = (TiXmlText *)0x0;
  }
  else {
    CopyTo(this,this_local);
  }
  return &this_local->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlText::Clone() const {
	TiXmlText* clone = 0;
	clone = new TiXmlText("");

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}